

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall mjs::print_visitor::operator()(print_visitor *this,regexp_literal_expression *e)

{
  long *plVar1;
  undefined4 uVar2;
  undefined8 in_RAX;
  wostream *pwVar3;
  undefined8 local_18;
  
  pwVar3 = this->os_;
  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
  local_18 = in_RAX;
  if (plVar1 != (long *)0x0) {
    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2f);
    local_18 = CONCAT44(local_18._4_4_,uVar2);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,(wchar_t *)&local_18,1)
    ;
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(e->re_).pattern_._M_dataplus._M_p,(e->re_).pattern_._M_string_length
                       );
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2f);
      local_18 = CONCAT44(uVar2,(wchar_t)local_18);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar3,(wchar_t *)((long)&local_18 + 4),1);
      mjs::operator<<(pwVar3,(e->re_).flags_);
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const regexp_literal_expression& e) {
        os_ << '/' << e.re().pattern() << '/' << e.re().flags();
    }